

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O2

invalid_param_spec * __thiscall
boost::runtime::specific_param_error<boost::runtime::invalid_param_spec,boost::runtime::init_error>
::operator<<(invalid_param_spec *__return_storage_ptr__,
            specific_param_error<boost::runtime::invalid_param_spec,boost::runtime::init_error>
            *this,basic_cstring<const_char> *val)

{
  string local_40;
  
  unit_test::utils::string_cast<boost::unit_test::basic_cstring<char_const>>
            (&local_40,(utils *)val,val);
  std::__cxx11::string::append((string *)(this + 0x18));
  std::__cxx11::string::~string((string *)&local_40);
  invalid_param_spec::invalid_param_spec(__return_storage_ptr__,(invalid_param_spec *)this);
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(T const& val) &&
    {
        this->msg.append( unit_test::utils::string_cast( val ) );

        return reinterpret_cast<Derived&&>(*this);
    }